

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O1

void __thiscall QSynth::setMasterVolume(QSynth *this,int masterVolume)

{
  QMutex *pQVar1;
  bool bVar2;
  Bit8u local_1c [4];
  
  if (this->realtimeHelper == (RealtimeHelper *)0x0) {
    pQVar1 = this->synthMutex;
    if (pQVar1 != (QMutex *)0x0) {
      LOCK();
      bVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar2) {
        (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (!bVar2) {
        QBasicMutex::lockInternal();
      }
    }
    if (this->state == SynthState_OPEN) {
      local_1c[0] = '\x10';
      local_1c[1] = '\0';
      local_1c[2] = 0x16;
      local_1c[3] = (char)masterVolume;
      MT32Emu::Synth::writeSysex(this->synth,'\x10',local_1c,4);
    }
    if (pQVar1 != (QMutex *)0x0) {
      LOCK();
      bVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
      if (bVar2) {
        (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
      }
      UNLOCK();
      if (!bVar2) {
        QBasicMutex::unlockInternal();
      }
    }
    return;
  }
  RealtimeHelper::setMasterVolume(this->realtimeHelper,masterVolume);
  return;
}

Assistant:

void QSynth::setMasterVolume(int masterVolume) {
	if (isRealtime()) {
		realtimeHelper->setMasterVolume(masterVolume);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) writeMasterVolumeSysex(synth, masterVolume);
	}
}